

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

void exprnode_dump(BinarySink *bs,ExprNode *en,char *origtext)

{
  void *pvVar1;
  BinarySink *pBVar2;
  char *str;
  size_t i;
  ulong uVar3;
  ptrlen pVar4;
  
  pvVar1 = (en->text).ptr;
  BinarySink_put_fmt(bs->binarysink_,"(%zu:%zu ",(long)pvVar1 - (long)origtext,
                     (long)pvVar1 + ((en->text).len - (long)origtext));
  switch(en->op) {
  case OP_AND:
  case OP_OR:
    pBVar2 = bs->binarysink_;
    str = "or";
    if (en->op == OP_AND) {
      str = "and";
    }
    pVar4 = ptrlen_from_asciz(str);
    BinarySink_put_datapl(pBVar2,pVar4);
    for (uVar3 = 0; uVar3 < (en->field_2).field_0.nsubexprs; uVar3 = uVar3 + 1) {
      BinarySink_put_byte(bs->binarysink_,' ');
      exprnode_dump(bs,(en->field_2).field_0.subexprs[uVar3],origtext);
    }
    break;
  case OP_NOT:
    pBVar2 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz("not ");
    BinarySink_put_datapl(pBVar2,pVar4);
    exprnode_dump(bs,(ExprNode *)(en->field_2).field_0.subexprs,origtext);
    break;
  case OP_HOSTNAME_WC:
    pBVar2 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz("host-wc \'");
    BinarySink_put_datapl(pBVar2,pVar4);
    pBVar2 = bs->binarysink_;
    pVar4 = ptrlen_from_asciz((char *)(en->field_2).field_0.subexprs);
    BinarySink_put_datapl(pBVar2,pVar4);
    BinarySink_put_byte(bs->binarysink_,'\'');
    break;
  case OP_PORT_RANGE:
    BinarySink_put_fmt(bs->binarysink_,"port-range %u %u",(ulong)(en->field_2).field_3.lo,
                       (ulong)(en->field_2).field_3.hi);
    break;
  default:
    __assert_fail("false && \"unhandled node type in exprnode_dump\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x2c2,"void exprnode_dump(BinarySink *, ExprNode *, const char *)");
  }
  BinarySink_put_byte(bs->binarysink_,')');
  return;
}

Assistant:

static void exprnode_dump(BinarySink *bs, ExprNode *en, const char *origtext)
{
    put_fmt(bs, "(%zu:%zu ",
            (size_t)((const char *)en->text.ptr - origtext),
            (size_t)((const char *)ptrlen_end(en->text) - origtext));
    switch (en->op) {
      case OP_AND:
      case OP_OR:
        put_dataz(bs, en->op == OP_AND ? "and" : "or");
        for (size_t i = 0; i < en->nsubexprs; i++) {
            put_byte(bs, ' ');
            exprnode_dump(bs, en->subexprs[i], origtext);
        }
        break;
      case OP_NOT:
        put_dataz(bs, "not ");
        exprnode_dump(bs, en->subexpr, origtext);
        break;
      case OP_HOSTNAME_WC:
        put_dataz(bs, "host-wc '");
        put_dataz(bs, en->wc);
        put_byte(bs, '\'');
        break;
      case OP_PORT_RANGE:
        put_fmt(bs, "port-range %u %u", en->lo, en->hi);
        break;
      default:
        unreachable("unhandled node type in exprnode_dump");
    }
    put_byte(bs, ')');
}